

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O1

bool IsChildWithParentsTree(Package *package)

{
  element_type *peVar1;
  bool bVar2;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it;
  __hashtable *__h;
  pointer psVar3;
  shared_ptr<const_CTransaction> *psVar4;
  pointer psVar5;
  long lVar6;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var7;
  long in_FS_OFFSET;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  parent_txids;
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  _Stack_a8;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsChildWithParents(package);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_009910b2;
  }
  SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&_Stack_a8);
  _Stack_a8._M_buckets = &_Stack_a8._M_single_bucket;
  _Stack_a8._M_bucket_count = 1;
  _Stack_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_a8._M_element_count = 0;
  _Stack_a8._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_a8._M_rehash_policy._M_next_resize = 0;
  _Stack_a8._M_single_bucket = (__node_base_ptr)0x0;
  psVar5 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + -1;
  if (psVar5 != psVar3) {
    do {
      peVar1 = (psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58 = *(undefined1 **)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uStack_50 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      uStack_4c = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
      local_48 = *(undefined4 *)
                  ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uStack_44 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14);
      uStack_40 = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      uStack_3c = *(undefined4 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c);
      local_60 = (undefined1 *)&_Stack_a8;
      std::
      _Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<uint256_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<uint256,true>>>>
                ((_Hashtable<uint256,uint256,std::allocator<uint256>,std::__detail::_Identity,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&_Stack_a8,&local_58,&local_60);
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar3);
  }
  __it._M_current =
       (package->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + -1;
  lVar6 = (long)psVar4 - (long)__it._M_current >> 6;
  local_58 = (undefined1 *)&_Stack_a8;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    local_58 = (undefined1 *)&_Stack_a8;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
              ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                            *)&local_58,__it);
      _Var7._M_current = __it._M_current;
      if (bVar2) goto LAB_009910a0;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
              ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                            *)&local_58,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_009910a0;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
              ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                            *)&local_58,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_009910a0;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
              ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                            *)&local_58,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_009910a0;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)psVar4 - (long)__it._M_current >> 4;
  if (lVar6 == 1) {
LAB_0099108a:
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
            ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                          *)&local_58,__it);
    _Var7._M_current = __it._M_current;
    if (!bVar2) {
      _Var7._M_current = psVar4;
    }
  }
  else if (lVar6 == 2) {
LAB_00991075:
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
            ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                          *)&local_58,__it);
    _Var7._M_current = __it._M_current;
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0099108a;
    }
  }
  else {
    _Var7._M_current = psVar4;
    if ((lVar6 == 3) &&
       (bVar2 = __gnu_cxx::__ops::
                _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
                ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                              *)&local_58,__it), _Var7._M_current = __it._M_current, !bVar2)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00991075;
    }
  }
LAB_009910a0:
  bVar2 = _Var7._M_current == psVar4;
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&_Stack_a8);
LAB_009910b2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool IsChildWithParentsTree(const Package& package)
{
    if (!IsChildWithParents(package)) return false;
    std::unordered_set<uint256, SaltedTxidHasher> parent_txids;
    std::transform(package.cbegin(), package.cend() - 1, std::inserter(parent_txids, parent_txids.end()),
                   [](const auto& ptx) { return ptx->GetHash(); });
    // Each parent must not have an input who is one of the other parents.
    return std::all_of(package.cbegin(), package.cend() - 1, [&](const auto& ptx) {
        for (const auto& input : ptx->vin) {
            if (parent_txids.count(input.prevout.hash) > 0) return false;
        }
        return true;
    });
}